

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_ThrowError2(JSContext *ctx,JSErrorEnum error_num,char *fmt,__va_list_tag *ap,
                      BOOL add_backtrace)

{
  JSValue JVar1;
  JSValue val;
  char buf [256];
  
  vsnprintf(buf,0x100,fmt,ap);
  JVar1.tag = ctx->native_error_proto[error_num].tag;
  JVar1.u.ptr = ctx->native_error_proto[error_num].u.ptr;
  JVar1 = JS_NewObjectProtoClass(ctx,JVar1,3);
  if ((int)JVar1.tag == 6) {
    JVar1 = (JSValue)(ZEXT816(2) << 0x40);
  }
  else {
    val = JS_NewString(ctx,buf);
    JS_DefinePropertyValue(ctx,JVar1,0x33,val,3);
  }
  if (add_backtrace != 0) {
    build_backtrace(ctx,JVar1,(char *)0x0,0,0);
  }
  JVar1 = JS_Throw(ctx,JVar1);
  return JVar1;
}

Assistant:

static JSValue JS_ThrowError2(JSContext *ctx, JSErrorEnum error_num,
                              const char *fmt, va_list ap, BOOL add_backtrace)
{
    char buf[256];
    JSValue obj, ret;

    vsnprintf(buf, sizeof(buf), fmt, ap);
    obj = JS_NewObjectProtoClass(ctx, ctx->native_error_proto[error_num],
                                 JS_CLASS_ERROR);
    if (unlikely(JS_IsException(obj))) {
        /* out of memory: throw JS_NULL to avoid recursing */
        obj = JS_NULL;
    } else {
        JS_DefinePropertyValue(ctx, obj, JS_ATOM_message,
                               JS_NewString(ctx, buf),
                               JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
    }
    if (add_backtrace) {
        build_backtrace(ctx, obj, NULL, 0, 0);
    }
    ret = JS_Throw(ctx, obj);
    return ret;
}